

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_int8.h
# Opt level: O1

void ncnn::conv3x3s1_winograd43_int8_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Option *opt)

{
  int *piVar1;
  size_t __size;
  undefined4 uVar2;
  undefined4 uVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  uint uVar8;
  Allocator *pAVar9;
  Allocator *pAVar10;
  size_t sVar11;
  size_t sVar12;
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  int iVar15;
  int iVar16;
  undefined4 uVar17;
  undefined1 auVar18 [14];
  undefined1 auVar19 [16];
  int n_1;
  uint uVar20;
  uint uVar21;
  undefined4 extraout_var;
  ulong uVar22;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 uVar23;
  int iVar24;
  ulong uVar25;
  long lVar26;
  int *piVar27;
  void *pvVar28;
  int *piVar29;
  long lVar30;
  int iVar31;
  long lVar32;
  uint uVar33;
  uint uVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  void *pvVar39;
  ulong uVar40;
  ulong uVar41;
  int iVar42;
  uint uVar43;
  int iVar45;
  uint uVar46;
  undefined1 auVar44 [16];
  uint uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar52 [16];
  void *local_3b8;
  void *local_3b0;
  int *local_3a8;
  void *local_398;
  ulong local_390;
  void *local_388;
  int tiles;
  void *local_378;
  int *local_370;
  void *local_348;
  uint uStack_33c;
  short w4 [6];
  short w3 [6];
  int local_2ec;
  int local_2e8;
  int local_2e4;
  short w2 [6];
  int local_2cc;
  int local_2c8;
  int local_2c4;
  short w1 [6];
  int local_2ac;
  int local_2a8;
  int local_2a4;
  short t5 [6];
  short t4 [6];
  short t3 [6];
  ulong local_278;
  short t2 [6];
  short t1 [6];
  short t0 [6];
  short w5 [6];
  undefined1 local_228 [56];
  size_t local_1f0;
  Mat top_blob_bordered;
  int local_148;
  int iStack_144;
  short w0 [6];
  short d1 [6];
  short d5 [6];
  short d4 [6];
  short d3 [6];
  short d2 [6];
  Option opt_b;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined2 uVar53;
  
  uVar2 = top_blob->w;
  uVar3 = top_blob->h;
  uVar8 = top_blob->c;
  local_228._0_8_ = bottom_blob->data;
  piVar27 = bottom_blob->refcount;
  local_228._8_4_ = SUB84(piVar27,0);
  local_228._12_4_ = (undefined4)((ulong)piVar27 >> 0x20);
  local_228._16_8_ = bottom_blob->elemsize;
  local_228._24_4_ = bottom_blob->elempack;
  local_228._32_8_ = bottom_blob->allocator;
  uVar17 = bottom_blob->c;
  local_228._40_4_ = bottom_blob->dims;
  local_228._44_4_ = bottom_blob->w;
  local_228._48_4_ = bottom_blob->h;
  local_228._52_4_ = bottom_blob->c;
  local_1f0 = bottom_blob->cstep;
  if (piVar27 != (int *)0x0) {
    LOCK();
    *piVar27 = *piVar27 + 1;
    UNLOCK();
  }
  iVar42 = uVar2 + 3;
  iVar45 = uVar3 + 3;
  uVar47 = (iVar42 / 4) * 4;
  iVar24 = (iVar45 / 4) * 4;
  opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
  opt_b.use_packing_layout = opt->use_packing_layout;
  opt_b._34_6_ = *(undefined6 *)&opt->field_0x22;
  opt_b.lightmode = opt->lightmode;
  opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
  opt_b.num_threads = opt->num_threads;
  opt_b.workspace_allocator = opt->workspace_allocator;
  opt_b.use_winograd_convolution = opt->use_winograd_convolution;
  opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
  opt_b.use_int8_inference = opt->use_int8_inference;
  opt_b.use_vulkan_compute = opt->use_vulkan_compute;
  opt_b.use_fp16_packed = opt->use_fp16_packed;
  opt_b.use_fp16_storage = opt->use_fp16_storage;
  opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
  opt_b.use_int8_storage = opt->use_int8_storage;
  opt_b.blob_allocator = opt->workspace_allocator;
  uVar40 = (long)(int)uVar47 | 2;
  copy_make_border(bottom_blob,(Mat *)local_228,0,(iVar24 + 2) - bottom_blob->h,0,
                   (uVar47 | 2) - bottom_blob->w,0,0.0,&opt_b);
  uVar43 = (int)(((uint)(iVar42 >> 0x1f) >> 0x1e) + iVar42) >> 2;
  uVar46 = (int)(((uint)(iVar45 >> 0x1f) >> 0x1e) + iVar45) >> 2;
  uVar20 = uVar46 * uVar43;
  pAVar9 = opt->workspace_allocator;
  uVar41 = (long)(int)(uVar20 * 0x24) + 7U & 0x7ffffffffffffff8;
  lVar32 = (long)(int)uVar17 * uVar41;
  if (lVar32 == 0) {
    local_3a8 = (int *)0x0;
    local_3b8 = (void *)0x0;
  }
  else {
    if (pAVar9 == (Allocator *)0x0) {
      top_blob_bordered.data = (void *)0x0;
      iVar42 = posix_memalign(&top_blob_bordered.data,0x10,lVar32 * 2 + 4);
      if (iVar42 != 0) {
        top_blob_bordered.data = (void *)0x0;
      }
    }
    else {
      iVar42 = (*pAVar9->_vptr_Allocator[2])();
      top_blob_bordered.data = (void *)CONCAT44(extraout_var,iVar42);
    }
    local_3a8 = (int *)((long)top_blob_bordered.data + lVar32 * 2);
    *(undefined4 *)((long)top_blob_bordered.data + lVar32 * 2) = 1;
    local_3b8 = top_blob_bordered.data;
  }
  if (0 < (int)uVar17) {
    iVar42 = (int)uVar40 * 4;
    auVar52._0_4_ = -(uint)(0 < (int)uVar2);
    auVar52._4_4_ = -(uint)(0 < (int)uVar2);
    auVar52._8_4_ = -(uint)(0 < (int)uVar3);
    auVar52._12_4_ = -(uint)(0 < (int)uVar3);
    uVar21 = movmskpd(iVar42,auVar52);
    uVar34 = 1;
    if (1 < (int)uVar43) {
      uVar34 = uVar43;
    }
    uVar25 = 1;
    if (1 < (int)uVar46) {
      uVar25 = (ulong)uVar46;
    }
    local_390 = 0;
    do {
      if ((byte)((byte)uVar21 >> 1) != 0) {
        pvVar39 = (void *)(uVar41 * 2 * local_390 + (long)local_3b8);
        uVar22 = 0;
        do {
          if ((uVar21 & 1) != 0) {
            lVar32 = local_228._0_8_ +
                     (long)(iVar42 * (int)uVar22) + local_1f0 * local_390 * local_228._16_8_;
            uVar33 = 0;
            do {
              lVar26 = 0;
              do {
                *(short *)((long)&top_blob_bordered.data + lVar26 * 2) =
                     (short)*(char *)(lVar32 + lVar26);
                lVar36 = lVar26 + lVar32 + uVar40;
                d1[lVar26] = (short)*(char *)(uVar40 + lVar26 + lVar32);
                lVar37 = lVar36 + uVar40;
                d2[lVar26] = (short)*(char *)(uVar40 + lVar36);
                lVar36 = lVar37 + uVar40;
                d3[lVar26] = (short)*(char *)(uVar40 + lVar37);
                d4[lVar26] = (short)*(char *)(uVar40 + lVar36);
                d5[lVar26] = (short)*(char *)(lVar36 + uVar40 * 2);
                lVar26 = lVar26 + 1;
              } while (lVar26 != 6);
              lVar26 = 0;
              do {
                sVar4 = *(short *)((long)d2 + lVar26);
                sVar5 = *(short *)((long)d4 + lVar26);
                *(short *)((long)w0 + lVar26) =
                     *(short *)((long)&top_blob_bordered.data + lVar26) * 4 + sVar4 * -5 + sVar5;
                sVar6 = *(short *)((long)d1 + lVar26);
                sVar7 = *(short *)((long)d3 + lVar26);
                *(short *)((long)w1 + lVar26) = sVar5 + (sVar4 + sVar6) * -4 + sVar7;
                *(short *)((long)w2 + lVar26) = (sVar5 - sVar7) + (sVar6 - sVar4) * 4;
                *(short *)((long)w3 + lVar26) = (sVar5 - (sVar4 + sVar6 * 2)) + sVar7 * 2;
                *(short *)((long)w4 + lVar26) = (sVar5 + sVar6 * 2) - (sVar4 + sVar7 * 2);
                *(short *)((long)w5 + lVar26) =
                     sVar6 * 4 + sVar7 * -5 + *(short *)((long)d5 + lVar26);
                lVar26 = lVar26 + 2;
              } while (lVar26 != 0xc);
              t3[0] = w0[3];
              t4[0] = w0[4];
              t5[0] = w0[5];
              t0[1] = w1[0];
              t0[0] = w0[0];
              t1[1] = w1[1];
              t1[0] = w0[1];
              t2[1] = w1[2];
              t2[0] = w0[2];
              t3[1] = w1[3];
              t4[1] = w1[4];
              t5[1] = w1[5];
              t3[2] = w2[3];
              t4[2] = w2[4];
              t5[2] = w2[5];
              t0[2] = (short)w2._0_4_;
              t0[3] = w3[0];
              t1[3] = w3[1];
              t1[2] = w2[1];
              t2[2] = (short)w2._4_4_;
              t2[3] = w3[2];
              t3[3] = w3[3];
              t4[3] = w3[4];
              t5[3] = w3[5];
              t3[4] = w4[3];
              t4[4] = w4[4];
              t5[4] = w4[5];
              t0[4] = (short)w4._0_4_;
              t0[5] = w5[0];
              t1[5] = w5[1];
              t1[4] = w4[1];
              t2[4] = (short)w4._4_4_;
              t2[5] = w5[2];
              t3[5] = w5[3];
              t4[5] = w5[4];
              t5[5] = w5[5];
              lVar26 = 0;
              do {
                sVar4 = *(short *)((long)t2 + lVar26);
                sVar5 = *(short *)((long)t4 + lVar26);
                *(short *)((long)&top_blob_bordered.data + lVar26) =
                     *(short *)((long)t0 + lVar26) * 4 + sVar4 * -5 + sVar5;
                sVar6 = *(short *)((long)t1 + lVar26);
                sVar7 = *(short *)((long)t3 + lVar26);
                *(short *)((long)d1 + lVar26) = sVar5 + (sVar4 + sVar6) * -4 + sVar7;
                *(short *)((long)d2 + lVar26) = (sVar5 - sVar7) + (sVar6 - sVar4) * 4;
                *(short *)((long)d3 + lVar26) = (sVar5 - (sVar4 + sVar6 * 2)) + sVar7 * 2;
                *(short *)((long)d4 + lVar26) = (sVar5 + sVar6 * 2) - (sVar4 + sVar7 * 2);
                *(short *)((long)d5 + lVar26) =
                     sVar6 * 4 + sVar7 * -5 + *(short *)((long)t5 + lVar26);
                lVar26 = lVar26 + 2;
              } while (lVar26 != 0xc);
              lVar26 = 0;
              do {
                *(undefined2 *)((long)pvVar39 + lVar26) =
                     *(undefined2 *)((long)&top_blob_bordered.data + lVar26);
                *(undefined2 *)((long)pvVar39 + lVar26 + 0xc) = *(undefined2 *)((long)d1 + lVar26);
                *(undefined2 *)((long)pvVar39 + lVar26 + 0x18) = *(undefined2 *)((long)d2 + lVar26);
                *(undefined2 *)((long)pvVar39 + lVar26 + 0x24) = *(undefined2 *)((long)d3 + lVar26);
                *(undefined2 *)((long)pvVar39 + lVar26 + 0x30) = *(undefined2 *)((long)d4 + lVar26);
                *(undefined2 *)((long)pvVar39 + lVar26 + 0x3c) = *(undefined2 *)((long)d5 + lVar26);
                lVar26 = lVar26 + 2;
              } while (lVar26 != 0xc);
              lVar32 = lVar32 + 4;
              pvVar39 = (void *)((long)pvVar39 + 0x48);
              uVar33 = uVar33 + 1;
            } while (uVar33 != uVar34);
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 != uVar25);
      }
      local_390 = local_390 + 1;
    } while (local_390 != (uint)uVar17);
  }
  top_blob_bordered.elemsize = 0;
  top_blob_bordered.elempack = 0;
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount._0_4_ = 0;
  top_blob_bordered.refcount._4_4_ = 0;
  top_blob_bordered.allocator = (Allocator *)0x0;
  top_blob_bordered.dims = 0;
  top_blob_bordered.w = 0;
  top_blob_bordered.h = 0;
  top_blob_bordered.c = 0;
  top_blob_bordered.cstep = 0;
  piVar27 = (int *)CONCAT44(local_228._12_4_,local_228._8_4_);
  if (piVar27 != (int *)0x0) {
    LOCK();
    *piVar27 = *piVar27 + -1;
    UNLOCK();
    if (*piVar27 == 0) {
      if ((Allocator *)local_228._32_8_ == (Allocator *)0x0) {
        if ((void *)local_228._0_8_ != (void *)0x0) {
          free((void *)local_228._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_228._32_8_)[3])();
      }
    }
  }
  piVar27 = (int *)CONCAT44(top_blob_bordered.refcount._4_4_,top_blob_bordered.refcount._0_4_);
  local_228._0_8_ = top_blob_bordered.data;
  local_228._8_4_ = top_blob_bordered.refcount._0_4_;
  local_228._12_4_ = top_blob_bordered.refcount._4_4_;
  local_228._16_8_ = top_blob_bordered.elemsize;
  local_228._24_4_ = top_blob_bordered.elempack;
  local_228._32_8_ = top_blob_bordered.allocator;
  local_228._44_4_ = top_blob_bordered.w;
  local_228._40_4_ = top_blob_bordered.dims;
  local_228._48_4_ = top_blob_bordered.h;
  local_228._52_4_ = top_blob_bordered.c;
  local_1f0 = top_blob_bordered.cstep;
  if (piVar27 != (int *)0x0) {
    LOCK();
    *piVar27 = *piVar27 + -1;
    UNLOCK();
    if (*piVar27 == 0) {
      if (top_blob_bordered.allocator == (Allocator *)0x0) {
        if (top_blob_bordered.data != (void *)0x0) {
          free(top_blob_bordered.data);
        }
      }
      else {
        (*(top_blob_bordered.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  top_blob_bordered.elemsize = 0;
  top_blob_bordered.elempack = 0;
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount._0_4_ = 0;
  top_blob_bordered.refcount._4_4_ = 0;
  top_blob_bordered.dims = 0;
  top_blob_bordered.w = 0;
  top_blob_bordered.h = 0;
  top_blob_bordered.c = 0;
  top_blob_bordered.cstep = 0;
  pAVar10 = opt->workspace_allocator;
  piVar27 = (int *)(long)(int)(uVar20 * 0x24);
  lVar32 = ((ulong)piVar27 & 0x3ffffffffffffffc) * (long)(int)uVar8;
  if (lVar32 == 0) {
    local_3b0 = (void *)0x0;
    local_370 = (int *)0x0;
    piVar29 = piVar27;
  }
  else {
    if (pAVar10 == (Allocator *)0x0) {
      top_blob_bordered.data = (void *)0x0;
      iVar42 = posix_memalign(&top_blob_bordered.data,0x10,lVar32 * 4 + 4);
      local_3b0 = top_blob_bordered.data;
      if (iVar42 != 0) {
        top_blob_bordered.data = (void *)0x0;
        local_3b0 = top_blob_bordered.data;
      }
    }
    else {
      iVar42 = (*pAVar10->_vptr_Allocator[2])(pAVar10);
      local_3b0 = (void *)CONCAT44(extraout_var_00,iVar42);
    }
    local_370 = (int *)((long)local_3b0 + lVar32 * 4);
    *(undefined4 *)((long)local_3b0 + lVar32 * 4) = 1;
    piVar29 = local_370;
  }
  if (0 < (int)uVar8) {
    local_378 = kernel_tm->data;
    sVar11 = kernel_tm->elemsize;
    sVar12 = kernel_tm->cstep;
    piVar29 = (int *)0x0;
    local_388 = local_3b0;
    do {
      if (0 < (int)uVar20) {
        iVar42 = kernel_tm->w;
        iVar45 = 0;
        uVar40 = 0;
        pvVar39 = local_388;
        do {
          memset(&top_blob_bordered,0,0x90);
          if (0 < (int)uVar17) {
            lVar32 = (ulong)(uint)(iVar45 * 8) + (long)local_3b8;
            uVar25 = 0;
            pvVar28 = local_378;
            do {
              lVar26 = 0;
              do {
                uVar22 = *(ulong *)(lVar32 + lVar26 * 2);
                auVar13._8_4_ = 0;
                auVar13._0_8_ = uVar22;
                auVar13._12_2_ = (short)(uVar22 >> 0x30);
                auVar14._8_2_ = (short)(uVar22 >> 0x20);
                auVar14._0_8_ = uVar22;
                auVar14._10_4_ = auVar13._10_4_;
                auVar18._6_8_ = 0;
                auVar18._0_6_ = auVar14._8_6_;
                auVar44._6_8_ = SUB148(auVar18 << 0x40,6);
                auVar44._4_2_ = (short)(uVar22 >> 0x10);
                auVar44._0_2_ = (ushort)uVar22;
                auVar44._2_2_ = 0;
                auVar44._14_2_ = 0;
                uVar22 = *(ulong *)((long)pvVar28 + lVar26 * 2);
                uVar53 = (undefined2)(uVar22 >> 0x30);
                auVar51._8_4_ = 0;
                auVar51._0_8_ = uVar22;
                auVar51._12_2_ = uVar53;
                auVar51._14_2_ = uVar53;
                uVar53 = (undefined2)(uVar22 >> 0x20);
                auVar50._12_4_ = auVar51._12_4_;
                auVar50._8_2_ = 0;
                auVar50._0_8_ = uVar22;
                auVar50._10_2_ = uVar53;
                auVar49._10_6_ = auVar50._10_6_;
                auVar49._8_2_ = uVar53;
                auVar49._0_8_ = uVar22;
                uVar53 = (undefined2)(uVar22 >> 0x10);
                auVar48._8_8_ = auVar49._8_8_;
                auVar48._6_2_ = uVar53;
                auVar48._4_2_ = uVar53;
                auVar48._0_2_ = (undefined2)uVar22;
                auVar48._2_2_ = auVar48._0_2_;
                auVar52 = pmaddwd(auVar48,auVar44);
                lVar36 = lVar26 * 4;
                iVar31 = *(int *)((long)&top_blob_bordered.data + lVar36 + 4);
                iVar15 = *(int *)((long)&top_blob_bordered.refcount + lVar36);
                iVar16 = *(int *)((long)&top_blob_bordered.refcount + lVar36 + 4);
                lVar37 = lVar26 * 4;
                *(int *)((long)&top_blob_bordered.data + lVar37) =
                     auVar52._0_4_ + *(int *)((long)&top_blob_bordered.data + lVar36);
                *(int *)((long)&top_blob_bordered.data + lVar37 + 4) = auVar52._4_4_ + iVar31;
                *(int *)((long)&top_blob_bordered.refcount + lVar37) = auVar52._8_4_ + iVar15;
                *(int *)((long)&top_blob_bordered.refcount + lVar37 + 4) = auVar52._12_4_ + iVar16;
                lVar26 = lVar26 + 4;
              } while (lVar26 != 0x24);
              uVar25 = uVar25 + 1;
              lVar32 = lVar32 + uVar41 * 2;
              pvVar28 = (void *)((long)pvVar28 + (long)iVar42 * sVar11);
            } while (uVar25 != (uint)uVar17);
          }
          lVar32 = 0;
          do {
            *(undefined4 *)((long)pvVar39 + lVar32 * 4) =
                 *(undefined4 *)((long)&top_blob_bordered.data + lVar32 * 4);
            lVar32 = lVar32 + 1;
          } while (lVar32 != 0x24);
          uVar40 = uVar40 + 1;
          iVar45 = iVar45 + 9;
          pvVar39 = (void *)((long)pvVar39 + 0x90);
        } while (uVar40 != uVar20);
      }
      piVar29 = (int *)((long)piVar29 + 1);
      local_378 = (void *)((long)local_378 + sVar12 * sVar11);
      local_388 = (void *)((long)local_388 + (long)piVar27 * 4);
    } while (piVar29 != (int *)(ulong)uVar8);
  }
  uVar23 = SUB84(piVar29,0);
  top_blob_bordered.elemsize = 0;
  top_blob_bordered.elempack = 0;
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount._0_4_ = 0;
  top_blob_bordered.refcount._4_4_ = 0;
  top_blob_bordered.allocator = (Allocator *)0x0;
  top_blob_bordered.dims = 0;
  top_blob_bordered.w = 0;
  top_blob_bordered.h = 0;
  top_blob_bordered.c = 0;
  top_blob_bordered.cstep = 0;
  if (local_3a8 != (int *)0x0) {
    LOCK();
    *local_3a8 = *local_3a8 + -1;
    UNLOCK();
    if (*local_3a8 == 0) {
      if (pAVar9 == (Allocator *)0x0) {
        if (local_3b8 != (void *)0x0) {
          free(local_3b8);
        }
      }
      else {
        (*pAVar9->_vptr_Allocator[3])(pAVar9,local_3b8);
      }
    }
  }
  pAVar9 = top_blob_bordered.allocator;
  pvVar39 = top_blob_bordered.data;
  piVar29 = (int *)CONCAT44(top_blob_bordered.refcount._4_4_,top_blob_bordered.refcount._0_4_);
  if (piVar29 != (int *)0x0) {
    LOCK();
    *piVar29 = *piVar29 + -1;
    UNLOCK();
    if (*piVar29 == 0) {
      if (top_blob_bordered.allocator == (Allocator *)0x0) {
        if (top_blob_bordered.data != (void *)0x0) {
          free(top_blob_bordered.data);
        }
      }
      else {
        (*(top_blob_bordered.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  top_blob_bordered.elemsize = 0;
  top_blob_bordered.elempack = 0;
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount._0_4_ = 0;
  top_blob_bordered.refcount._4_4_ = 0;
  top_blob_bordered.allocator = (Allocator *)0x0;
  top_blob_bordered.dims = 0;
  top_blob_bordered.w = 0;
  top_blob_bordered.h = 0;
  top_blob_bordered.c = 0;
  top_blob_bordered.cstep = 0;
  top_blob_bordered.allocator = opt->workspace_allocator;
  auVar19._4_4_ = -(uint)(iVar24 == 0);
  auVar19._0_4_ = -(uint)(uVar47 == 0);
  auVar19._8_4_ = -(uint)(uVar8 == 0);
  auVar19._12_4_ = 0;
  movmskps(uVar23,auVar19 << 0x20);
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount._0_4_ = 0;
  top_blob_bordered.refcount._4_4_ = 0;
  piVar1 = (int *)0x0;
  top_blob_bordered.elemsize = 4;
  top_blob_bordered.elempack = 1;
  top_blob_bordered.dims = 3;
  top_blob_bordered.w = uVar47;
  top_blob_bordered.h = iVar24;
  top_blob_bordered.c = uVar8;
  top_blob_bordered.cstep = (long)(int)(iVar24 * uVar47) & 0x3ffffffffffffff0;
  lVar32 = top_blob_bordered.cstep * (long)(int)uVar8;
  if (lVar32 != 0) {
    __size = lVar32 * 4 + 4;
    if (top_blob_bordered.allocator == (Allocator *)0x0) {
      d1[0] = 0;
      d1[1] = 0;
      d1[2] = 0;
      d1[3] = 0;
      iVar42 = posix_memalign((void **)d1,0x10,__size);
      top_blob_bordered.data = (void *)d1._0_8_;
      if (iVar42 != 0) {
        d1[0] = 0;
        d1[1] = 0;
        d1[2] = 0;
        d1[3] = 0;
        top_blob_bordered.data = (void *)d1._0_8_;
      }
    }
    else {
      iVar42 = (*(top_blob_bordered.allocator)->_vptr_Allocator[2])
                         (top_blob_bordered.allocator,__size);
      top_blob_bordered.data = (void *)CONCAT44(extraout_var_01,iVar42);
    }
    piVar1 = (int *)((long)top_blob_bordered.data + lVar32 * 4);
    top_blob_bordered.refcount._0_4_ = SUB84(piVar1,0);
    top_blob_bordered.refcount._4_4_ = (undefined4)((ulong)piVar1 >> 0x20);
    *(undefined4 *)((long)top_blob_bordered.data + lVar32 * 4) = 1;
  }
  if (0 < (int)uVar8) {
    uVar40 = 1;
    if (1 < (int)uVar43) {
      uVar40 = (ulong)uVar43;
    }
    uVar41 = 1;
    if (1 < (int)uVar46) {
      uVar41 = (ulong)uVar46;
    }
    _tiles = (int *)0x0;
    local_398 = local_3b0;
    do {
      if (0 < (int)uVar3) {
        lVar32 = top_blob_bordered.cstep * top_blob_bordered.elemsize * (long)_tiles;
        lVar26 = (long)top_blob_bordered.w * top_blob_bordered.elemsize;
        local_348 = local_398;
        local_278 = 0;
        do {
          if (0 < (int)uVar2) {
            lVar35 = (long)top_blob_bordered.data + (local_278 * 4 + 3) * lVar26 + lVar32;
            lVar38 = (long)top_blob_bordered.data + (local_278 * 4 + 2) * lVar26 + lVar32;
            lVar36 = (long)top_blob_bordered.data + (local_278 * 4 + 1) * lVar26 + lVar32;
            lVar37 = (long)top_blob_bordered.data + local_278 * 4 * lVar26 + lVar32;
            uVar25 = 0;
            pvVar28 = local_348;
            do {
              lVar30 = 0;
              do {
                *(undefined4 *)((long)d1 + lVar30) = *(undefined4 *)((long)pvVar28 + lVar30);
                *(undefined4 *)((long)d2 + lVar30) = *(undefined4 *)((long)pvVar28 + lVar30 + 0x18);
                *(undefined4 *)((long)d3 + lVar30) = *(undefined4 *)((long)pvVar28 + lVar30 + 0x30);
                *(undefined4 *)((long)d4 + lVar30) = *(undefined4 *)((long)pvVar28 + lVar30 + 0x48);
                *(undefined4 *)((long)d5 + lVar30) = *(undefined4 *)((long)pvVar28 + lVar30 + 0x60);
                *(undefined4 *)((long)w0 + lVar30) = *(undefined4 *)((long)pvVar28 + lVar30 + 0x78);
                lVar30 = lVar30 + 4;
              } while (lVar30 != 0x18);
              lVar30 = 0;
              do {
                iVar42 = *(int *)((long)d3 + lVar30) + *(int *)((long)d2 + lVar30);
                iVar45 = *(int *)((long)d4 + lVar30) + *(int *)((long)d5 + lVar30);
                *(int *)((long)w1 + lVar30) = iVar42 + *(int *)((long)d1 + lVar30) + iVar45;
                iVar31 = *(int *)((long)d4 + lVar30) - *(int *)((long)d5 + lVar30);
                iVar24 = *(int *)((long)d2 + lVar30) - *(int *)((long)d3 + lVar30);
                *(int *)((long)w2 + lVar30) = iVar24 + iVar31 * 2;
                *(int *)((long)w3 + lVar30) = iVar42 + iVar45 * 4;
                *(int *)((long)w4 + lVar30) = iVar24 + iVar31 * 8 + *(int *)((long)w0 + lVar30);
                lVar30 = lVar30 + 4;
              } while (lVar30 != 0x18);
              w5._0_4_ = w1._0_4_ + local_2ac + w1._8_4_ + w1._4_4_ + local_2a8;
              w5._4_4_ = w2._0_4_ + local_2cc + w2._8_4_ + w2._4_4_ + local_2c8;
              w5._8_4_ = w3._0_4_ + local_2ec + w3._8_4_ + w3._4_4_ + local_2e8;
              t0._0_4_ = (local_2ac - local_2a8) * 2 + (w1._4_4_ - w1._8_4_);
              t0._4_4_ = (local_2cc - local_2c8) * 2 + (w2._4_4_ - w2._8_4_);
              t0._8_4_ = (local_2ec - local_2e8) * 2 + (w3._4_4_ - w3._8_4_);
              t1._0_4_ = (local_2a8 + local_2ac) * 4 + w1._8_4_ + w1._4_4_;
              t1._4_4_ = (local_2c8 + local_2cc) * 4 + w2._8_4_ + w2._4_4_;
              t1._8_4_ = (local_2e8 + local_2ec) * 4 + w3._8_4_ + w3._4_4_;
              t2._0_4_ = (w1._4_4_ - w1._8_4_) + local_2a4 + (local_2ac - local_2a8) * 8;
              t2._4_4_ = (w2._4_4_ - w2._8_4_) + local_2c4 + (local_2cc - local_2c8) * 8;
              t2._8_4_ = (w3._4_4_ - w3._8_4_) + local_2e4 + (local_2ec - local_2e8) * 8;
              lVar30 = 0;
              do {
                *(int *)(lVar37 + lVar30) = *(int *)((long)w5 + lVar30) / 0x240;
                *(int *)(lVar36 + lVar30) = *(int *)((long)t0 + lVar30) / 0x240;
                *(int *)(lVar38 + lVar30) = *(int *)((long)t1 + lVar30) / 0x240;
                *(int *)(lVar35 + lVar30) = *(int *)((long)t2 + lVar30) / 0x240;
                lVar30 = lVar30 + 4;
              } while (lVar30 != 0x10);
              lVar37 = lVar37 + 0x10;
              lVar36 = lVar36 + 0x10;
              lVar38 = lVar38 + 0x10;
              lVar35 = lVar35 + 0x10;
              uVar25 = uVar25 + 1;
              pvVar28 = (void *)((long)pvVar28 + 0x90);
            } while (uVar25 != uVar40);
          }
          local_278 = local_278 + 1;
          local_348 = (void *)((long)local_348 + (long)(int)uVar43 * 0x90);
        } while (local_278 != uVar41);
      }
      _tiles = (int *)((long)_tiles + 1);
      local_398 = (void *)((long)local_398 + (long)piVar27 * 4);
    } while (_tiles != (int *)(ulong)uVar8);
  }
  top_blob_bordered.refcount = piVar1;
  copy_cut_border(&top_blob_bordered,top_blob,0,top_blob_bordered.h - top_blob->h,0,
                  top_blob_bordered.w - top_blob->w,opt);
  if (top_blob_bordered.refcount != (int *)0x0) {
    LOCK();
    *top_blob_bordered.refcount = *top_blob_bordered.refcount + -1;
    UNLOCK();
    if (*top_blob_bordered.refcount == 0) {
      if (top_blob_bordered.allocator == (Allocator *)0x0) {
        if (top_blob_bordered.data != (void *)0x0) {
          free(top_blob_bordered.data);
        }
      }
      else {
        (*(top_blob_bordered.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  top_blob_bordered.elemsize = 0;
  top_blob_bordered.elempack = 0;
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount._0_4_ = 0;
  top_blob_bordered.refcount._4_4_ = 0;
  top_blob_bordered.dims = 0;
  top_blob_bordered.w = 0;
  top_blob_bordered.h = 0;
  top_blob_bordered.c = 0;
  top_blob_bordered.cstep = 0;
  if (local_370 != (int *)0x0) {
    LOCK();
    *local_370 = *local_370 + -1;
    UNLOCK();
    if (*local_370 == 0) {
      if (pAVar10 == (Allocator *)0x0) {
        if (local_3b0 != (void *)0x0) {
          free(local_3b0);
        }
      }
      else {
        (*pAVar10->_vptr_Allocator[3])(pAVar10,local_3b0);
      }
    }
  }
  if (piVar29 != (int *)0x0) {
    LOCK();
    *piVar29 = *piVar29 + -1;
    UNLOCK();
    if (*piVar29 == 0) {
      if (pAVar9 == (Allocator *)0x0) {
        if (pvVar39 != (void *)0x0) {
          free(pvVar39);
        }
      }
      else {
        (*pAVar9->_vptr_Allocator[3])(pAVar9);
      }
    }
  }
  piVar27 = (int *)CONCAT44(local_228._12_4_,local_228._8_4_);
  if (piVar27 != (int *)0x0) {
    LOCK();
    *piVar27 = *piVar27 + -1;
    UNLOCK();
    if (*piVar27 == 0) {
      if ((Allocator *)local_228._32_8_ == (Allocator *)0x0) {
        if ((void *)local_228._0_8_ != (void *)0x0) {
          free((void *)local_228._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_228._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 4n+2, winograd F(4,3)
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 3) / 4 * 4;
    outh = (outh + 3) / 4 * 4;

    w = outw + 2;
    h = outh + 2;
    Option opt_b = opt;
    opt_b.blob_allocator = opt.workspace_allocator;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, 0, 0.f, opt_b);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tm = outw / 4 * 6;
        int h_tm = outh / 4 * 6;

        int nColBlocks = h_tm/6; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/6;

        const int tiles = nColBlocks * nRowBlocks;

        bottom_blob_tm.create(6*6, tiles, inch, 2u, opt.workspace_allocator);

        // BT
        // const float itm[4][4] = {
        //     {4.0f, 0.0f, -5.0f, 0.0f, 1.0f, 0.0f},
        //     {0.0f,-4.0f, -4.0f, 1.0f, 1.0f, 0.0f},
        //     {0.0f, 4.0f, -4.0f,-1.0f, 1.0f, 0.0f},
        //     {0.0f,-2.0f, -1.0f, 2.0f, 1.0f, 0.0f},
        //     {0.0f, 2.0f, -1.0f,-2.0f, 1.0f, 0.0f},
        //     {0.0f, 4.0f,  0.0f,-5.0f, 0.0f, 1.0f}
        // };

		// 0 =	4 * r00  - 5 * r02	+ r04
        // 1 = -4 * (r01 + r02)  + r03 + r04
        // 2 =	4 * (r01 - r02)  - r03 + r04
        // 3 = -2 * r01 - r02 + 2 * r03 + r04
        // 4 =	2 * r01 - r02 - 2 * r03 + r04
		// 5 =	4 * r01 - 5 * r03 + r05

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<inch; q++)
        {
            const signed char* img = bottom_blob_bordered.channel(q);
            short* out_tm0 = bottom_blob_tm.channel(q);

            for (int j = 0; j < nColBlocks; j++)
            {
                const signed char* r0 = img + w * j * 4;
                const signed char* r1 = r0 + w;
                const signed char* r2 = r1 + w;
                const signed char* r3 = r2 + w;
                const signed char* r4 = r3 + w;
                const signed char* r5 = r4 + w;

                for (int i = 0; i < nRowBlocks; i++)
                {
                    short d0[6],d1[6],d2[6],d3[6],d4[6],d5[6];
                    short w0[6],w1[6],w2[6],w3[6],w4[6],w5[6];
                    short t0[6],t1[6],t2[6],t3[6],t4[6],t5[6];

                    // load
                    for (int n = 0; n < 6; n++)
                    {
                        d0[n] = r0[n];
                        d1[n] = r1[n];
                        d2[n] = r2[n];
                        d3[n] = r3[n];
                        d4[n] = r4[n];
                        d5[n] = r5[n];
                    }
                    // w = B_t * d
                    for (int n = 0; n < 6; n++)
                    {   
                        w0[n] =  4*d0[n]          - 5*d2[n]           + d4[n];
                        w1[n] =          -4*d1[n] - 4*d2[n] +   d3[n] + d4[n];
                        w2[n] =           4*d1[n] - 4*d2[n] -   d3[n] + d4[n];
                        w3[n] =          -2*d1[n] -   d2[n] + 2*d3[n] + d4[n];
                        w4[n] =           2*d1[n] -   d2[n] - 2*d3[n] + d4[n];
                        w5[n] =           4*d1[n]           - 5*d3[n]          + d5[n];
                    }
                    // transpose d to d_t
                    {
                        t0[0]=w0[0]; t1[0]=w0[1]; t2[0]=w0[2]; t3[0]=w0[3]; t4[0]=w0[4]; t5[0]=w0[5];
                        t0[1]=w1[0]; t1[1]=w1[1]; t2[1]=w1[2]; t3[1]=w1[3]; t4[1]=w1[4]; t5[1]=w1[5];
                        t0[2]=w2[0]; t1[2]=w2[1]; t2[2]=w2[2]; t3[2]=w2[3]; t4[2]=w2[4]; t5[2]=w2[5];
                        t0[3]=w3[0]; t1[3]=w3[1]; t2[3]=w3[2]; t3[3]=w3[3]; t4[3]=w3[4]; t5[3]=w3[5];
                        t0[4]=w4[0]; t1[4]=w4[1]; t2[4]=w4[2]; t3[4]=w4[3]; t4[4]=w4[4]; t5[4]=w4[5];
                        t0[5]=w5[0]; t1[5]=w5[1]; t2[5]=w5[2]; t3[5]=w5[3]; t4[5]=w5[4]; t5[5]=w5[5];
                    }                   
                    // d = B_t * d_t
                    for (int n = 0; n < 6; n++)
                    {   
                        d0[n] =  4*t0[n]           - 5*t2[n]           + t4[n];
                        d1[n] =          - 4*t1[n] - 4*t2[n] +   t3[n] + t4[n];
                        d2[n] =            4*t1[n] - 4*t2[n] -   t3[n] + t4[n];
                        d3[n] =          - 2*t1[n] -   t2[n] + 2*t3[n] + t4[n];
                        d4[n] =            2*t1[n] -   t2[n] - 2*t3[n] + t4[n];
                        d5[n] =            4*t1[n]           - 5*t3[n]          + t5[n];
                    }                   
                    // save to out_tm
                    for (int n = 0; n < 6; n++)
                    {
                        out_tm0[n   ] = d0[n];
                        out_tm0[n+ 6] = d1[n];
                        out_tm0[n+12] = d2[n];
                        out_tm0[n+18] = d3[n];
                        out_tm0[n+24] = d4[n];
                        out_tm0[n+30] = d5[n];
                    }

                    r0 += 4;
                    r1 += 4;
                    r2 += 4;
                    r3 += 4;
                    r4 += 4;
                    r5 += 4;

                    out_tm0 += 36;
                }
            }
        }
    }
    bottom_blob_bordered = Mat();

    // BEGIN dot
    Mat top_blob_tm;
    {
        int w_tm = outw / 4 * 6;
        int h_tm = outh / 4 * 6;

        int nColBlocks = h_tm/6; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/6;

        const int tiles = nColBlocks * nRowBlocks; 

        top_blob_tm.create(36, tiles, outch, 4u, opt.workspace_allocator);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<outch; p++)
        {
            Mat out0_tm = top_blob_tm.channel(p);
            const Mat kernel0_tm = kernel_tm.channel(p);

            for (int i=0; i<tiles; i++)
            {
                int* output0_tm = out0_tm.row<int>(i);

                int sum0[36] = {0};

                for (int q=0; q<inch; q++)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* k0 = kernel0_tm.row<short>(q);

                    for (int n=0; n<36; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                    }
                }

                for (int n=0; n<36; n++)
                {
                    output0_tm[n] = sum0[n];
                }
            }
        }
    }
    bottom_blob_tm = Mat();
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    top_blob_bordered.create(outw, outh, outch, 4u, opt.workspace_allocator);
    {
        // AT
        // const float itm[4][6] = {
        //     {1.0f, 1.0f,  1.0f, 1.0f,  1.0f, 0.0f},
        //     {0.0f, 1.0f, -1.0f, 2.0f, -2.0f, 0.0f},
        //     {0.0f, 1.0f,  1.0f, 4.0f,  4.0f, 0.0f},
        //     {0.0f, 1.0f, -1.0f, 8.0f, -8.0f, 1.0f}
        // };

        // 0 =	r00 + r01 + r02 + r03 +	r04
        // 1 =		  r01 - r02 + 2 * (r03 - r04)
        // 2 =		  r01 + r02 + 4 * (r03 + r04)
        // 3 =		  r01 - r02 + 8 * (r03 - r04)  + r05
        

        int w_tm = outw / 4 * 6;
        int h_tm = outh / 4 * 6;

        int nColBlocks = h_tm/6; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/6;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<outch; p++)
        {
            Mat out_tm = top_blob_tm.channel(p);
            Mat out = top_blob_bordered.channel(p);

            for (int j=0; j<nColBlocks; j++)
            {
                int* outRow0 = out.row<int>(j*4);
                int* outRow1 = out.row<int>(j*4+1);
                int* outRow2 = out.row<int>(j*4+2);
                int* outRow3 = out.row<int>(j*4+3);                

                for(int i=0; i<nRowBlocks; i++)
                {
                    int* out_tile = out_tm.row<int>(j*nRowBlocks + i);

                    int s0[6],s1[6],s2[6],s3[6],s4[6],s5[6];
                    int w0[6],w1[6],w2[6],w3[6];
                    int d0[4],d1[4],d2[4],d3[4],d4[4],d5[4];
                    int o0[4],o1[4],o2[4],o3[4];
                    // load
                    for (int n = 0; n < 6; n++)
                    {
                        s0[n] = out_tile[n];
                        s1[n] = out_tile[n+ 6];
                        s2[n] = out_tile[n+12];
                        s3[n] = out_tile[n+18];
                        s4[n] = out_tile[n+24];
                        s5[n] = out_tile[n+30];
                    }
                    // w = A_T * W
                    for (int n = 0; n < 6; n++)
                    {
                        w0[n] = s0[n] + s1[n] + s2[n] +   s3[n] +   s4[n];
                        w1[n] =         s1[n] - s2[n] + 2*s3[n] - 2*s4[n];
                        w2[n] =         s1[n] + s2[n] + 4*s3[n] + 4*s4[n];
                        w3[n] =         s1[n] - s2[n] + 8*s3[n] - 8*s4[n] + s5[n];
                    }
                    // transpose w to w_t
                    {
                        d0[0] = w0[0]; d0[1] = w1[0]; d0[2] = w2[0]; d0[3] = w3[0];
                        d1[0] = w0[1]; d1[1] = w1[1]; d1[2] = w2[1]; d1[3] = w3[1];
                        d2[0] = w0[2]; d2[1] = w1[2]; d2[2] = w2[2]; d2[3] = w3[2];
                        d3[0] = w0[3]; d3[1] = w1[3]; d3[2] = w2[3]; d3[3] = w3[3];
                        d4[0] = w0[4]; d4[1] = w1[4]; d4[2] = w2[4]; d4[3] = w3[4];
                        d5[0] = w0[5]; d5[1] = w1[5]; d5[2] = w2[5]; d5[3] = w3[5];
                    }
                    // Y = A_T * w_t
                    for (int n = 0; n < 4; n++)
                    {
                        o0[n] = d0[n] + d1[n] + d2[n] +   d3[n] +   d4[n];
                        o1[n] =         d1[n] - d2[n] + 2*d3[n] - 2*d4[n];
                        o2[n] =         d1[n] + d2[n] + 4*d3[n] + 4*d4[n];
                        o3[n] =         d1[n] - d2[n] + 8*d3[n] - 8*d4[n] + d5[n];
                    }
                    // save to top blob tm
                    for (int n = 0; n < 4; n++)
                    {
                        outRow0[n] = o0[n] / 576;
                        outRow1[n] = o1[n] / 576;
                        outRow2[n] = o2[n] / 576;
                        outRow3[n] = o3[n] / 576;
                    }

                    outRow0 += 4;
                    outRow1 += 4;
                    outRow2 += 4;
                    outRow3 += 4;
                }
            }
        }
    }
    // END transform output 

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}